

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool google::protobuf::compiler::js::anon_unknown_0::IsPrimitive(string *type)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)type);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)type);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)type);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)type);
        bVar2 = iVar1 == 0;
      }
    }
  }
  return bVar2;
}

Assistant:

bool IsPrimitive(const std::string& type) {
  return type == "undefined" || type == "string" || type == "number" ||
         type == "boolean";
}